

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O1

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  int iVar4;
  void *local_58;
  int *piStack_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  (**mb->_vptr_ModelBin)(&local_58,mb,(ulong)(uint)this->bias_data_size);
  pMVar1 = &this->bias_data;
  if (pMVar1 != (Mat *)&local_58) {
    if (piStack_50 != (int *)0x0) {
      LOCK();
      *piStack_50 = *piStack_50 + 1;
      UNLOCK();
    }
    piVar2 = (this->bias_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = (this->bias_data).data;
        pAVar3 = (this->bias_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->bias_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->bias_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->bias_data).refcount = (int *)0x0;
    (this->bias_data).dims = 0;
    (this->bias_data).w = 0;
    (this->bias_data).h = 0;
    (this->bias_data).c = 0;
    (this->bias_data).cstep = 0;
    (this->bias_data).data = local_58;
    (this->bias_data).refcount = piStack_50;
    (this->bias_data).elemsize = local_48;
    (this->bias_data).packing = local_40;
    (this->bias_data).allocator = local_38;
    (this->bias_data).dims = local_30;
    (this->bias_data).w = iStack_2c;
    (this->bias_data).h = iStack_28;
    (this->bias_data).c = iStack_24;
    (this->bias_data).cstep = local_20;
  }
  if (piStack_50 != (int *)0x0) {
    LOCK();
    *piStack_50 = *piStack_50 + -1;
    UNLOCK();
    if (*piStack_50 == 0) {
      if (local_38 == (Allocator *)0x0) {
        if (local_58 != (void *)0x0) {
          free(local_58);
        }
      }
      else {
        (**(code **)(*(long *)local_38 + 0x18))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    iVar4 = -100;
  }
  else {
    iVar4 = -100;
    if ((long)(this->bias_data).c * (this->bias_data).cstep != 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}